

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

void parameterize_category_list
               (embryonic_category_reference *ctgs,wchar_t n,wchar_t ind,ui_entry *entry)

{
  wchar_t wVar1;
  category_reference *pcVar2;
  _Bool _Var3;
  long lVar4;
  _Bool *p_Var5;
  
  pcVar2 = (category_reference *)mem_alloc((long)n << 4);
  entry->categories = pcVar2;
  entry->n_category = n;
  entry->nalloc_category = n;
  if (L'\0' < n) {
    p_Var5 = &ctgs->priority_set;
    lVar4 = 0;
    do {
      *(char **)((long)&pcVar2->name + lVar4) =
           ((embryonic_category_reference *)(p_Var5 + -0x10))->name;
      if (*p_Var5 == true) {
        if ((long)*(wchar_t *)(p_Var5 + -8) < 1) {
          wVar1 = *(wchar_t *)(p_Var5 + -4);
        }
        else {
          wVar1 = (*priority_schemes[*(wchar_t *)(p_Var5 + -8)].priority)(ind);
          pcVar2 = entry->categories;
        }
        _Var3 = true;
      }
      else {
        wVar1 = L'\0';
        _Var3 = false;
      }
      *(wchar_t *)((long)&pcVar2->priority + lVar4) = wVar1;
      (&pcVar2->priority_set)[lVar4] = _Var3;
      lVar4 = lVar4 + 0x10;
      p_Var5 = p_Var5 + 0x18;
    } while ((ulong)(uint)n << 4 != lVar4);
  }
  return;
}

Assistant:

static void parameterize_category_list(
	const struct embryonic_category_reference *ctgs, int n, int ind,
	struct ui_entry *entry)
{
	int i;

	entry->categories = mem_alloc(n * sizeof(*entry->categories));
	entry->n_category = n;
	entry->nalloc_category = n;

	for (i = 0; i < n; ++i) {
		entry->categories[i].name = ctgs[i].name;
		if (ctgs[i].priority_set) {
			entry->categories[i].priority =
				(ctgs[i].psource_index > 0) ?
				(*priority_schemes[ctgs[i].psource_index].priority)(ind) :
				ctgs[i].priority;
			entry->categories[i].priority_set = true;
		} else {
			entry->categories[i].priority = 0;
			entry->categories[i].priority_set = false;
		}
	}
}